

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O0

void __thiscall QSpanBuffer::addSpan(QSpanBuffer *this,int x,int len,int y,int coverage)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QSpanBuffer *in_RDI;
  int in_R8D;
  
  if ((in_R8D != 0) && (in_EDX != 0)) {
    in_RDI->m_spans[in_RDI->m_spanCount].x = in_ESI;
    in_RDI->m_spans[in_RDI->m_spanCount].len = in_EDX;
    in_RDI->m_spans[in_RDI->m_spanCount].y = in_ECX;
    in_RDI->m_spans[in_RDI->m_spanCount].coverage = (uchar)in_R8D;
    iVar1 = in_RDI->m_spanCount + 1;
    in_RDI->m_spanCount = iVar1;
    if (iVar1 == 0x100) {
      flushSpans(in_RDI);
    }
  }
  return;
}

Assistant:

void addSpan(int x, int len, int y, int coverage)
    {
        if (!coverage || !len)
            return;

        Q_ASSERT(coverage >= 0 && coverage <= 255);
        Q_ASSERT(y >= m_clipRect.top());
        Q_ASSERT(y <= m_clipRect.bottom());
        Q_ASSERT(x >= m_clipRect.left());
        Q_ASSERT(x + int(len) - 1 <= m_clipRect.right());

        m_spans[m_spanCount].x = x;
        m_spans[m_spanCount].len = len;
        m_spans[m_spanCount].y = y;
        m_spans[m_spanCount].coverage = coverage;

        if (++m_spanCount == SPAN_BUFFER_SIZE)
            flushSpans();
    }